

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.hpp
# Opt level: O2

void __thiscall helics::Translator::Translator(Translator *this)

{
  (this->super_Interface).mCore = (Core *)0x0;
  (this->super_Interface).handle.hid = -1700000000;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  (this->super_Interface).mName._M_string_length = 0;
  (this->super_Interface).mName.field_2._M_local_buf[0] = '\0';
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Translator_004d5218;
  this->disableAssign = false;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

Interface(Core* core, InterfaceHandle hid, std::string_view actName):
        mCore(core), handle(hid), mName(actName)
    {
    }